

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile(cmLocalUnixMakefileGenerator3 *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  Directory local_2e8;
  Directory local_2c0;
  undefined4 local_294;
  undefined1 local_290 [8];
  cmGeneratedFileStream infoFileStream;
  allocator local_31;
  string local_30 [8];
  string infoFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  infoFileName.field_2._8_8_ = this;
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar3,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar3 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_30,pcVar3);
  std::__cxx11::string::operator+=(local_30,"/CMakeDirectoryInformation.cmake");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_290,pcVar3,false);
  bVar1 = std::ios::operator!((ios *)(local_290 + (long)*(_func_int **)((long)local_290 + -0x18)));
  if ((bVar1 & 1) == 0) {
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_290,true);
    WriteDisclaimer(this,(ostream *)local_290);
    poVar4 = std::operator<<((ostream *)local_290,"# Relative path conversion top directories.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_SOURCE \"");
    cmState::Snapshot::GetDirectory
              (&local_2c0,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot
              );
    pcVar3 = cmState::Directory::GetRelativePathTopSource(&local_2c0);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_RELATIVE_PATH_TOP_BINARY \"");
    cmState::Snapshot::GetDirectory
              (&local_2e8,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot
              );
    pcVar3 = cmState::Directory::GetRelativePathTopBinary(&local_2e8);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = std::operator<<(poVar4,"\")\n");
    std::operator<<(poVar4,"\n");
    bVar2 = cmSystemTools::GetForceUnixPaths();
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)local_290,"# Force unix paths in dependencies.\n");
      poVar4 = std::operator<<(poVar4,"set(CMAKE_FORCE_UNIX_PATHS 1)\n");
      std::operator<<(poVar4,"\n");
    }
    poVar4 = std::operator<<((ostream *)local_290,"\n");
    poVar4 = std::operator<<(poVar4,"# The C and CXX include file regular expressions for ");
    std::operator<<(poVar4,"this directory.\n");
    std::operator<<((ostream *)local_290,"set(CMAKE_C_INCLUDE_REGEX_SCAN ");
    pcVar3 = cmMakefile::GetIncludeRegularExpression
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_290,pcVar3);
    std::operator<<((ostream *)local_290,")\n");
    std::operator<<((ostream *)local_290,"set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ");
    pcVar3 = cmMakefile::GetComplainRegularExpression
                       ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile);
    WriteCMakeArgument((ostream *)local_290,pcVar3);
    std::operator<<((ostream *)local_290,")\n");
    std::operator<<((ostream *)local_290,
                    "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n");
    std::operator<<((ostream *)local_290,
                    "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN ${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n");
    local_294 = 0;
  }
  else {
    local_294 = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_290);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteDirectoryInformationFile()
{
  std::string infoFileName = this->GetCurrentBinaryDirectory();
  infoFileName += cmake::GetCMakeFilesDirectory();
  infoFileName += "/CMakeDirectoryInformation.cmake";

  // Open the output file.
  cmGeneratedFileStream infoFileStream(infoFileName.c_str());
  if(!infoFileStream)
    {
    return;
    }

  infoFileStream.SetCopyIfDifferent(true);
  // Write the do not edit header.
  this->WriteDisclaimer(infoFileStream);

  // Setup relative path conversion tops.
  infoFileStream
    << "# Relative path conversion top directories.\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_SOURCE \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopSource()
    << "\")\n"
    << "set(CMAKE_RELATIVE_PATH_TOP_BINARY \""
    << this->StateSnapshot.GetDirectory().GetRelativePathTopBinary()
    << "\")\n"
    << "\n";

  // Tell the dependency scanner to use unix paths if necessary.
  if(cmSystemTools::GetForceUnixPaths())
    {
    infoFileStream
      << "# Force unix paths in dependencies.\n"
      << "set(CMAKE_FORCE_UNIX_PATHS 1)\n"
      << "\n";
    }

  // Store the include regular expressions for this directory.
  infoFileStream
    << "\n"
    << "# The C and CXX include file regular expressions for "
    << "this directory.\n";
  infoFileStream
    << "set(CMAKE_C_INCLUDE_REGEX_SCAN ";
  this->WriteCMakeArgument(infoFileStream,
                           this->Makefile->GetIncludeRegularExpression());
  infoFileStream
    << ")\n";
  infoFileStream
    << "set(CMAKE_C_INCLUDE_REGEX_COMPLAIN ";
  this->WriteCMakeArgument(infoFileStream,
                           this->Makefile->GetComplainRegularExpression());
  infoFileStream
    << ")\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_SCAN ${CMAKE_C_INCLUDE_REGEX_SCAN})\n";
  infoFileStream
    << "set(CMAKE_CXX_INCLUDE_REGEX_COMPLAIN "
    "${CMAKE_C_INCLUDE_REGEX_COMPLAIN})\n";
}